

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryNode
          (AssbinImporter *this,IOStream *stream,aiNode **onode,aiNode *parent)

{
  char *pcVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ai_uint32 aVar8;
  aiNode *this_00;
  uint *puVar9;
  aiNode **ppaVar10;
  aiMetadata *paVar11;
  aiString *paVar12;
  aiMetadataEntry *__s;
  double dVar13;
  aiString *paVar14;
  runtime_error *this_01;
  ulong __n;
  long lVar15;
  uint i;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  aiString local_438;
  
  uVar4 = Read<unsigned_int>(stream);
  if (uVar4 != 0x123c) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_438.data + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_438,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_01,(string *)&local_438);
    *(undefined ***)this_01 = &PTR__runtime_error_00875f28;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  Read<aiString>(&local_438,stream);
  uVar16 = local_438._0_8_ & 0xffffffff;
  (this_00->mName).length = local_438.length;
  memcpy((this_00->mName).data,(void *)((long)&local_438 + 4),uVar16);
  (this_00->mName).data[uVar16] = '\0';
  Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)&local_438,stream);
  *(undefined8 *)&(this_00->mTransformation).d1 = local_438.data._44_8_;
  *(undefined8 *)&(this_00->mTransformation).d3 = local_438.data._52_8_;
  *(undefined8 *)&(this_00->mTransformation).c1 = local_438.data._28_8_;
  *(undefined8 *)&(this_00->mTransformation).c3 = local_438.data._36_8_;
  *(undefined8 *)&(this_00->mTransformation).b1 = local_438.data._12_8_;
  *(undefined8 *)&(this_00->mTransformation).b3 = local_438.data._20_8_;
  *(undefined8 *)&this_00->mTransformation = local_438._0_8_;
  *(undefined8 *)&(this_00->mTransformation).a3 = local_438.data._4_8_;
  uVar4 = Read<unsigned_int>(stream);
  uVar5 = Read<unsigned_int>(stream);
  uVar6 = Read<unsigned_int>(stream);
  if (parent != (aiNode *)0x0) {
    this_00->mParent = parent;
  }
  if (uVar5 != 0) {
    puVar9 = (uint *)operator_new__((ulong)uVar5 * 4);
    this_00->mMeshes = puVar9;
    uVar16 = 0;
    do {
      uVar7 = Read<unsigned_int>(stream);
      this_00->mMeshes[uVar16] = uVar7;
      this_00->mNumMeshes = this_00->mNumMeshes + 1;
      uVar16 = uVar16 + 1;
    } while (uVar5 != uVar16);
  }
  if (uVar4 != 0) {
    ppaVar10 = (aiNode **)operator_new__((ulong)uVar4 << 3);
    this_00->mChildren = ppaVar10;
    uVar16 = 0;
    do {
      ReadBinaryNode(this,stream,(aiNode **)((long)this_00->mChildren + uVar16),this_00);
      this_00->mNumChildren = this_00->mNumChildren + 1;
      uVar16 = uVar16 + 8;
    } while ((ulong)uVar4 << 3 != uVar16);
  }
  if (uVar6 != 0) {
    paVar11 = (aiMetadata *)operator_new(0x18);
    paVar11->mNumProperties = uVar6;
    uVar16 = (ulong)uVar6;
    paVar12 = (aiString *)operator_new__(uVar16 * 0x404);
    paVar14 = paVar12;
    do {
      paVar14->length = 0;
      paVar14->data[0] = '\0';
      memset(paVar14->data + 1,0x1b,0x3ff);
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar12 + uVar16);
    paVar11->mKeys = paVar12;
    __s = (aiMetadataEntry *)operator_new__(uVar16 << 4);
    uVar17 = 0;
    memset(__s,0,uVar16 << 4);
    paVar11->mValues = __s;
    this_00->mMetaData = paVar11;
    lVar15 = 8;
    do {
      Read<aiString>(&local_438,stream);
      paVar12 = this_00->mMetaData->mKeys;
      paVar14 = (aiString *)(paVar12->data + (uVar17 - 4));
      if (paVar14 != &local_438) {
        __n = local_438._0_8_ & 0xffffffff;
        pcVar1 = paVar12->data + (uVar17 - 4);
        *(ai_uint32 *)pcVar1 = local_438.length;
        memcpy(pcVar1 + 4,(void *)((long)&local_438 + 4),__n);
        paVar14->data[__n] = '\0';
      }
      uVar3 = Read<unsigned_short>(stream);
      *(uint *)((long)this_00->mMetaData->mValues + lVar15 + -8) = (uint)uVar3;
      switch(*(undefined4 *)((long)this_00->mMetaData->mValues + lVar15 + -8)) {
      case 0:
        paVar14 = (aiString *)operator_new(1);
        bVar2 = Read<bool>(stream);
        *(bool *)&paVar14->length = bVar2;
        break;
      case 1:
        paVar14 = (aiString *)operator_new(4);
        aVar8 = Read<int>(stream);
        paVar14->length = aVar8;
        break;
      case 2:
        paVar14 = (aiString *)operator_new(8);
        dVar13 = (double)Read<unsigned_long>(stream);
        *(double *)paVar14 = dVar13;
        break;
      case 3:
        paVar14 = (aiString *)operator_new(4);
        fVar18 = Read<float>(stream);
        paVar14->length = (ai_uint32)fVar18;
        break;
      case 4:
        paVar14 = (aiString *)operator_new(8);
        dVar13 = Read<double>(stream);
        *(double *)paVar14 = dVar13;
        break;
      case 5:
        paVar14 = (aiString *)operator_new(0x404);
        Read<aiString>(paVar14,stream);
        break;
      case 6:
        paVar14 = (aiString *)operator_new(0xc);
        fVar18 = Read<float>(stream);
        fVar19 = Read<float>(stream);
        fVar20 = Read<float>(stream);
        *(ulong *)paVar14 = CONCAT44(fVar19,fVar18);
        *(float *)(paVar14->data + 4) = fVar20;
        break;
      default:
        paVar14 = (aiString *)0x0;
      }
      *(aiString **)((long)&this_00->mMetaData->mValues->mType + lVar15) = paVar14;
      uVar17 = uVar17 + 0x404;
      lVar15 = lVar15 + 0x10;
    } while (uVar16 * 0x404 != uVar17);
  }
  *onode = this_00;
  return;
}

Assistant:

void AssbinImporter::ReadBinaryNode( IOStream * stream, aiNode** onode, aiNode* parent ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    std::unique_ptr<aiNode> node(new aiNode());

    node->mName = Read<aiString>(stream);
    node->mTransformation = Read<aiMatrix4x4>(stream);
    unsigned numChildren = Read<unsigned int>(stream);
    unsigned numMeshes = Read<unsigned int>(stream);
	unsigned int nb_metadata = Read<unsigned int>(stream);

    if(parent) {
        node->mParent = parent;
    }

    if (numMeshes)
    {
        node->mMeshes = new unsigned int[numMeshes];
        for (unsigned int i = 0; i < numMeshes; ++i) {
            node->mMeshes[i] = Read<unsigned int>(stream);
            node->mNumMeshes++;
        }
    }

    if (numChildren) {
        node->mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; ++i) {
            ReadBinaryNode( stream, &node->mChildren[i], node.get() );
            node->mNumChildren++;
        }
    }

    if ( nb_metadata > 0 ) {
        node->mMetaData = aiMetadata::Alloc(nb_metadata);
        for (unsigned int i = 0; i < nb_metadata; ++i) {
            node->mMetaData->mKeys[i] = Read<aiString>(stream);
            node->mMetaData->mValues[i].mType = (aiMetadataType) Read<uint16_t>(stream);
            void* data = nullptr;

            switch (node->mMetaData->mValues[i].mType) {
                case AI_BOOL:
                    data = new bool(Read<bool>(stream));
                    break;
                case AI_INT32:
                    data = new int32_t(Read<int32_t>(stream));
                    break;
                case AI_UINT64:
                    data = new uint64_t(Read<uint64_t>(stream));
                    break;
                case AI_FLOAT:
                    data = new float(Read<float>(stream));
                    break;
                case AI_DOUBLE:
                    data = new double(Read<double>(stream));
                    break;
                case AI_AISTRING:
                    data = new aiString(Read<aiString>(stream));
                    break;
                case AI_AIVECTOR3D:
                    data = new aiVector3D(Read<aiVector3D>(stream));
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }

			node->mMetaData->mValues[i].mData = data;
		}
	}
    *onode = node.release();
}